

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImFont::RenderText(ImFont *this,ImDrawList *draw_list,float size,ImVec2 pos,ImU32 col,
                  ImVec4 *clip_rect,char *text_begin,char *text_end,float wrap_width,
                  bool cpu_fine_clip)

{
  uint *puVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  char cVar4;
  uint uVar5;
  size_t sVar6;
  void *pvVar7;
  char *pcVar8;
  ImFontGlyph *pIVar9;
  int iVar10;
  ImDrawIdx IVar11;
  char *text_end_00;
  char *text;
  float scale;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar18;
  ulong uVar17;
  undefined8 uVar19;
  float fVar20;
  float fVar21;
  float x1;
  uint local_a0;
  float local_98;
  uint c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  ulong local_60;
  ImDrawVert *local_58;
  ImDrawIdx *local_50;
  uint local_44;
  int local_40;
  int local_3c;
  char *local_38;
  
  if (text_end == (char *)0x0) {
    sVar6 = strlen(text_begin);
    text_end = text_begin + sVar6;
  }
  fVar12 = pos.y;
  fVar15 = (float)(int)fVar12;
  fStack_74 = (float)(int)fVar12;
  fStack_70 = (float)(int)fVar12;
  fStack_6c = (float)(int)fVar12;
  fVar12 = clip_rect->w;
  if (fVar15 <= fVar12) {
    scale = size / this->FontSize;
    fVar13 = this->FontSize * scale;
    if ((wrap_width <= 0.0) && (local_78 = clip_rect->y, fVar15 + fVar13 < local_78)) {
      while ((fVar13 + fVar15 < local_78 && (text_begin < text_end))) {
        pvVar7 = memchr(text_begin,10,(long)text_end - (long)text_begin);
        text_begin = (char *)((long)pvVar7 + 1);
        if (pvVar7 == (void *)0x0) {
          text_begin = text_end;
        }
        fStack_74 = 0.0;
        fStack_70 = 0.0;
        fStack_6c = 0.0;
        fVar15 = fVar13 + fVar15;
      }
    }
    text_end_00 = text_end;
    local_78 = fVar15;
    if ((wrap_width <= 0.0) && (pcVar8 = text_begin, 10000 < (long)text_end - (long)text_begin)) {
      while ((text_end_00 = pcVar8, fVar15 < fVar12 && (pcVar8 < text_end))) {
        pvVar7 = memchr(pcVar8,10,(long)text_end - (long)pcVar8);
        pcVar8 = (char *)((long)pvVar7 + 1);
        if (pvVar7 == (void *)0x0) {
          pcVar8 = text_end;
        }
        fVar15 = fVar15 + fVar13;
      }
    }
    if (text_begin != text_end_00) {
      local_98 = pos.x;
      fVar12 = (float)(int)local_98;
      iVar10 = (int)text_end_00 - (int)text_begin;
      local_3c = iVar10 * 6;
      local_40 = (draw_list->IdxBuffer).Size;
      ImDrawList::PrimReserve(draw_list,local_3c,iVar10 * 4);
      local_58 = draw_list->_VtxWritePtr;
      local_50 = draw_list->_IdxWritePtr;
      local_60 = (ulong)draw_list->_VtxCurrentIdx;
      local_44 = col | 0xffffff;
      local_38 = (char *)0x0;
      x1 = fVar12;
      local_a0 = col;
LAB_001328b2:
      do {
        uVar17 = CONCAT44(fStack_74,local_78);
        uVar19 = CONCAT44(fStack_6c,fStack_70);
        pcVar8 = local_38;
        text = text_begin;
        fVar15 = x1;
        fVar16 = local_78;
        fVar14 = fStack_74;
        fVar20 = fStack_70;
        fVar21 = fStack_6c;
        while( true ) {
          if (text_end_00 <= text) goto LAB_00132b87;
          if (wrap_width <= 0.0) goto LAB_0013298f;
          if (pcVar8 == (char *)0x0) {
            pcVar8 = CalcWordWrapPositionA
                               (this,scale,text,text_end_00,(fVar12 - fVar15) + wrap_width);
            uVar17 = uVar17 & 0xffffffff;
            uVar19 = 0;
            pcVar8 = pcVar8 + (pcVar8 == text);
            fVar16 = local_78;
            fVar14 = fStack_74;
            fVar20 = fStack_70;
            fVar21 = fStack_6c;
          }
          fVar18 = (float)(uVar17 >> 0x20);
          if (text < pcVar8) break;
          uVar17 = CONCAT44(fVar18,(float)uVar17 + fVar13);
          do {
            pcVar8 = text;
            text = pcVar8;
            if (text_end_00 <= pcVar8) goto LAB_00132971;
            cVar4 = *pcVar8;
            text = pcVar8 + 1;
          } while ((cVar4 == '\t') || (cVar4 == ' '));
          text = pcVar8 + 1;
          if (cVar4 != '\n') {
            text = pcVar8;
          }
LAB_00132971:
          pcVar8 = (char *)0x0;
          fVar15 = fVar12;
        }
        text_begin = text;
        fVar16 = (float)uVar17;
        fVar14 = fVar18;
        fVar20 = (float)uVar19;
        fVar21 = (float)((ulong)uVar19 >> 0x20);
        x1 = fVar15;
        local_38 = pcVar8;
LAB_0013298f:
        fStack_6c = fVar21;
        fStack_70 = fVar20;
        fStack_74 = fVar14;
        local_78 = fVar16;
        c = (uint)*text_begin;
        if (*text_begin < '\0') {
          iVar10 = ImTextCharFromUtf8(&c,text_begin,text_end_00);
          if (c == 0) break;
          text_begin = text_begin + iVar10;
        }
        else {
          text_begin = text_begin + 1;
        }
        uVar5 = c;
        if (0x1f < c) {
LAB_00132a0e:
          pIVar9 = FindGlyph(this,(ImWchar)c);
          if (pIVar9 != (ImFontGlyph *)0x0) {
            fVar15 = pIVar9->AdvanceX;
            if (((((undefined1  [40])*pIVar9 & (undefined1  [40])0x2) != (undefined1  [40])0x0) &&
                (fVar16 = x1 + 1.0, x1 <= clip_rect->z)) && (clip_rect->x <= fVar16)) {
              local_a0 = local_a0 & 0xffffff | uVar5 << 0x18;
              uVar5 = local_44;
              if (((undefined1  [40])*pIVar9 & (undefined1  [40])0x1) == (undefined1  [40])0x0) {
                uVar5 = local_a0;
              }
              fVar14 = local_78 + -0.5;
              IVar11 = (ImDrawIdx)local_60;
              *local_50 = IVar11;
              local_50[1] = IVar11 + 1;
              local_50[2] = IVar11 + 2;
              local_50[3] = IVar11;
              local_50[4] = IVar11 + 2;
              local_50[5] = IVar11 + 3;
              (local_58->pos).x = x1;
              (local_58->pos).y = fVar14;
              local_58->col = uVar5;
              IVar2.x = pIVar9->U0;
              IVar2.y = pIVar9->V0;
              local_58[1].pos.x = fVar16;
              local_58[1].pos.y = fVar14;
              local_58[1].col = uVar5;
              local_58[1].uv.y = IVar2.y;
              local_58[2].pos.x = fVar16;
              local_58[2].pos.y = fVar14;
              local_58[2].col = uVar5;
              IVar3.x = pIVar9->U1;
              IVar3.y = pIVar9->V1;
              local_58->uv = IVar2;
              local_58[1].uv.x = IVar3.x;
              local_58[2].uv = IVar3;
              local_58[3].pos.x = x1;
              local_58[3].pos.y = fVar14;
              local_58[3].col = uVar5;
              local_58[3].uv.x = IVar2.x;
              local_58[3].uv.y = IVar3.y;
              local_58 = local_58 + 4;
              local_60 = (ulong)((int)local_60 + 4);
              local_50 = local_50 + 6;
            }
            x1 = x1 + fVar15 * scale;
          }
          goto LAB_001328b2;
        }
        if (c != 10) {
          if (c != 0xd) goto LAB_00132a0e;
          goto LAB_001328b2;
        }
        local_78 = local_78 + fVar13;
        x1 = fVar12;
      } while (local_78 < clip_rect->w || local_78 == clip_rect->w);
LAB_00132b87:
      (draw_list->VtxBuffer).Size =
           (int)(((long)local_58 - (long)(draw_list->VtxBuffer).Data) / 0x14);
      iVar10 = (int)((ulong)((long)local_50 - (long)(draw_list->IdxBuffer).Data) >> 1);
      (draw_list->IdxBuffer).Size = iVar10;
      puVar1 = &(draw_list->CmdBuffer).Data[(long)(draw_list->CmdBuffer).Size + -1].ElemCount;
      *puVar1 = *puVar1 + (iVar10 - (local_40 + local_3c));
      draw_list->_VtxWritePtr = local_58;
      draw_list->_IdxWritePtr = local_50;
      draw_list->_VtxCurrentIdx = (uint)local_60;
    }
  }
  return;
}

Assistant:

void ImFont::RenderText(ImDrawList* draw_list, float size, ImVec2 pos, ImU32 col, const ImVec4& clip_rect, const char* text_begin, const char* text_end, float wrap_width, bool cpu_fine_clip) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // ImGui:: functions generally already provides a valid text_end, so this is merely to handle direct calls.

    // Align to be pixel perfect
    pos.x = IM_FLOOR(pos.x);
    pos.y = IM_FLOOR(pos.y);
    float x = pos.x;
    float y = pos.y;
    if (y > clip_rect.w)
        return;

    const float scale = size / FontSize;
    const float line_height = FontSize * scale;
    const bool word_wrap_enabled = (wrap_width > 0.0f);
    const char* word_wrap_eol = NULL;

    // Fast-forward to first visible line
    const char* s = text_begin;
    if (y + line_height < clip_rect.y && !word_wrap_enabled)
        while (y + line_height < clip_rect.y && s < text_end)
        {
            s = (const char*)memchr(s, '\n', text_end - s);
            s = s ? s + 1 : text_end;
            y += line_height;
        }

    // For large text, scan for the last visible line in order to avoid over-reserving in the call to PrimReserve()
    // Note that very large horizontal line will still be affected by the issue (e.g. a one megabyte string buffer without a newline will likely crash atm)
    if (text_end - s > 10000 && !word_wrap_enabled)
    {
        const char* s_end = s;
        float y_end = y;
        while (y_end < clip_rect.w && s_end < text_end)
        {
            s_end = (const char*)memchr(s_end, '\n', text_end - s_end);
            s_end = s_end ? s_end + 1 : text_end;
            y_end += line_height;
        }
        text_end = s_end;
    }
    if (s == text_end)
        return;

    // Reserve vertices for remaining worse case (over-reserving is useful and easily amortized)
    const int vtx_count_max = (int)(text_end - s) * 4;
    const int idx_count_max = (int)(text_end - s) * 6;
    const int idx_expected_size = draw_list->IdxBuffer.Size + idx_count_max;
    draw_list->PrimReserve(idx_count_max, vtx_count_max);

    ImDrawVert* vtx_write = draw_list->_VtxWritePtr;
    ImDrawIdx* idx_write = draw_list->_IdxWritePtr;
    unsigned int vtx_current_idx = draw_list->_VtxCurrentIdx;

    const ImU32 col_untinted = col | ~IM_COL32_A_MASK;

    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
            {
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - (x - pos.x));
                if (word_wrap_eol == s) // Wrap_width is too small to fit anything. Force displaying 1 character to minimize the height discontinuity.
                    word_wrap_eol++;    // +1 may not be a character start point in UTF-8 but it's ok because we use s >= word_wrap_eol below
            }

            if (s >= word_wrap_eol)
            {
                x = pos.x;
                y += line_height;
                word_wrap_eol = NULL;

                // Wrapping skips upcoming blanks
                while (s < text_end)
                {
                    const char c = *s;
                    if (ImCharIsBlankA(c)) { s++; } else if (c == '\n') { s++; break; } else { break; }
                }
                continue;
            }
        }

        // Decode and advance source
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
        {
            s += 1;
        }
        else
        {
            s += ImTextCharFromUtf8(&c, s, text_end);
            if (c == 0) // Malformed UTF-8?
                break;
        }

        if (c < 32)
        {
            if (c == '\n')
            {
                x = pos.x;
                y += line_height;
                if (y > clip_rect.w)
                    break; // break out of main loop
                continue;
            }
            if (c == '\r')
                continue;
        }

        const ImFontGlyph* glyph = FindGlyph((ImWchar)c);
        if (glyph == NULL)
            continue;

        float char_width = glyph->AdvanceX * scale;
        if (glyph->Visible)
        {
            // We don't do a second finer clipping test on the Y axis as we've already skipped anything before clip_rect.y and exit once we pass clip_rect.w
            float x1 = x;
            float x2 = x + 1.0;
            float y1 = y - 0.5f;
            float y2 = y - 0.5f;
            if (x1 <= clip_rect.z && x2 >= clip_rect.x)
            {
                // Render a character
                float u1 = glyph->U0;
                float v1 = glyph->V0;
                float u2 = glyph->U1;
                float v2 = glyph->V1;

                // CPU side clipping used to fit text in their frame when the frame is too small. Only does clipping for axis aligned quads.
                if (false && cpu_fine_clip)
                {
                    if (x1 < clip_rect.x)
                    {
                        u1 = u1 + (1.0f - (x2 - clip_rect.x) / (x2 - x1)) * (u2 - u1);
                        x1 = clip_rect.x;
                    }
                    if (y1 < clip_rect.y)
                    {
                        v1 = v1 + (1.0f - (y2 - clip_rect.y) / (y2 - y1)) * (v2 - v1);
                        y1 = clip_rect.y;
                    }
                    if (x2 > clip_rect.z)
                    {
                        u2 = u1 + ((clip_rect.z - x1) / (x2 - x1)) * (u2 - u1);
                        x2 = clip_rect.z;
                    }
                    if (y2 > clip_rect.w)
                    {
                        v2 = v1 + ((clip_rect.w - y1) / (y2 - y1)) * (v2 - v1);
                        y2 = clip_rect.w;
                    }
                    if (y1 >= y2)
                    {
                        x += char_width;
                        continue;
                    }
                }

                col &= 0x00FFFFFF;
                col |= (c << 24);
                // Support for untinted glyphs
                ImU32 glyph_col = glyph->Colored ? col_untinted : col;

                // We are NOT calling PrimRectUV() here because non-inlined causes too much overhead in a debug builds. Inlined here:
                {
                    idx_write[0] = (ImDrawIdx)(vtx_current_idx); idx_write[1] = (ImDrawIdx)(vtx_current_idx+1); idx_write[2] = (ImDrawIdx)(vtx_current_idx+2);
                    idx_write[3] = (ImDrawIdx)(vtx_current_idx); idx_write[4] = (ImDrawIdx)(vtx_current_idx+2); idx_write[5] = (ImDrawIdx)(vtx_current_idx+3);
                    vtx_write[0].pos.x = x1; vtx_write[0].pos.y = y1; vtx_write[0].col = glyph_col; vtx_write[0].uv.x = u1; vtx_write[0].uv.y = v1;
                    vtx_write[1].pos.x = x2; vtx_write[1].pos.y = y1; vtx_write[1].col = glyph_col; vtx_write[1].uv.x = u2; vtx_write[1].uv.y = v1;
                    vtx_write[2].pos.x = x2; vtx_write[2].pos.y = y2; vtx_write[2].col = glyph_col; vtx_write[2].uv.x = u2; vtx_write[2].uv.y = v2;
                    vtx_write[3].pos.x = x1; vtx_write[3].pos.y = y2; vtx_write[3].col = glyph_col; vtx_write[3].uv.x = u1; vtx_write[3].uv.y = v2;
                    vtx_write += 4;
                    vtx_current_idx += 4;
                    idx_write += 6;
                }
            }
        }
        x += char_width;
    }

    // Give back unused vertices (clipped ones, blanks) ~ this is essentially a PrimUnreserve() action.
    draw_list->VtxBuffer.Size = (int)(vtx_write - draw_list->VtxBuffer.Data); // Same as calling shrink()
    draw_list->IdxBuffer.Size = (int)(idx_write - draw_list->IdxBuffer.Data);
    draw_list->CmdBuffer[draw_list->CmdBuffer.Size - 1].ElemCount -= (idx_expected_size - draw_list->IdxBuffer.Size);
    draw_list->_VtxWritePtr = vtx_write;
    draw_list->_IdxWritePtr = idx_write;
    draw_list->_VtxCurrentIdx = vtx_current_idx;
}